

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QRomanCalendar::monthName
          (QString *__return_storage_ptr__,QRomanCalendar *this,QLocale *locale,int month,int year,
          FormatType format)

{
  QLocalePrivate *pQVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QSystemLocale *pQVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  long in_FS_OFFSET;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((locale->d).d.ptr)->m_data == &systemLocaleData) {
    uVar7 = 0x10;
    if (format != NarrowFormat) {
      uVar7 = format == ShortFormat | 0xe;
    }
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = systemLocale();
    ::QVariant::QVariant(&local_78,month);
    (*pQVar6->_vptr_QSystemLocale[2])(&local_58,pQVar6,(ulong)uVar7,&local_78);
    ::QVariant::~QVariant(&local_78);
    bVar3 = ::QVariant::isNull((QVariant *)&local_58);
    if (bVar3) {
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      if (!bVar3) goto LAB_00314eb9;
    }
  }
  pQVar1 = (locale->d).d.ptr;
  iVar4 = (*(this->super_QCalendarBackend)._vptr_QCalendarBackend[0x19])(this);
  lVar2 = pQVar1->m_index;
  iVar5 = (*(this->super_QCalendarBackend)._vptr_QCalendarBackend[0x1a])(this);
  rawMonthName(__return_storage_ptr__,
               (QCalendarLocale *)(lVar2 * 0x1a + CONCAT44(extraout_var,iVar4)),
               (char16_t *)CONCAT44(extraout_var_00,iVar5),month,format);
LAB_00314eb9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QRomanCalendar::monthName(const QLocale &locale, int month, int year,
                                  QLocale::FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (locale.d->m_data == &systemLocaleData) {
        Q_ASSERT(month >= 1 && month <= 12);
        QSystemLocale::QueryType queryType = QSystemLocale::MonthNameLong;
        switch (format) {
        case QLocale::LongFormat:
            queryType = QSystemLocale::MonthNameLong;
            break;
        case QLocale::ShortFormat:
            queryType = QSystemLocale::MonthNameShort;
            break;
        case QLocale::NarrowFormat:
            queryType = QSystemLocale::MonthNameNarrow;
            break;
        }
        QVariant res = systemLocale()->query(queryType, month);
        if (!res.isNull())
            return res.toString();
    }
#endif

    return QCalendarBackend::monthName(locale, month, year, format);
}